

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_op.hpp
# Opt level: O0

void asio::detail::
     executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
     ::do_complete(void *owner,scheduler_operation *base,error_code *param_3,size_t param_4)

{
  std_fenced_block local_65 [8];
  fenced_block b;
  executor_function local_58;
  executor_function handler;
  ptr p;
  allocator<void> allocator;
  executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
  *o;
  size_t param_3_local;
  error_code *param_2_local;
  scheduler_operation *base_local;
  void *owner_local;
  
  handler.impl_ = (impl_base *)((long)&p.p + 7);
  p.a = (allocator<void> *)base;
  p.v = base;
  executor_function::executor_function(&local_58,(executor_function *)(base + 1));
  ptr::reset((ptr *)&handler);
  if (owner != (void *)0x0) {
    std_fenced_block::std_fenced_block(local_65,half);
    asio_handler_invoke_helpers::
    invoke<asio::detail::executor_function,asio::detail::executor_function>(&local_58,&local_58);
    std_fenced_block::~std_fenced_block(local_65);
  }
  executor_function::~executor_function(&local_58);
  ptr::~ptr((ptr *)&handler);
  return;
}

Assistant:

static void do_complete(void* owner, Operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    executor_op* o(static_cast<executor_op*>(base));
    Alloc allocator(o->allocator_);
    ptr p = { detail::addressof(allocator), o, o };

    ASIO_HANDLER_COMPLETION((*o));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(o->handler_));
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      asio_handler_invoke_helpers::invoke(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }